

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::lts_20240722::CondVar::WaitCommon(CondVar *this,Mutex *mutex,KernelTimeout t)

{
  ulong uVar1;
  bool bVar2;
  State SVar3;
  PerThreadSynch *thread_arg;
  undefined1 *how_arg;
  CondVar *local_e0;
  char *local_d8;
  char *absl_raw_log_internal_basename;
  CondVar *local_c8;
  KernelTimeout local_c0;
  undefined1 local_b8 [8];
  SynchWaitParams waitp;
  intptr_t v;
  MuHow mutex_how;
  intptr_t mutex_v;
  bool rc;
  Mutex *mutex_local;
  CondVar *this_local;
  KernelTimeout t_local;
  memory_order __b_1;
  memory_order __b;
  
  mutex_v._7_1_ = false;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  how_arg = kSharedS;
  if (((mutex->mu_).super___atomic_base<long>._M_i & 8U) != 0) {
    how_arg = kExclusiveS;
  }
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = *(ulong *)this;
  waitp._56_8_ = this;
  base_internal::AtomicHook<void(*)(char_const*,void_const*)>::operator()
            ((anonymous_namespace)::cond_var_tracer,(char (*) [5])"Wait",
             (CondVar **)&waitp.should_submit_contention_data);
  if ((uVar1 & 2) != 0) {
    PostSynchEvent(this,10);
  }
  local_c0.rep_ = t.rep_;
  thread_arg = Synch_GetPerThreadAnnotated(mutex);
  SynchWaitParams::SynchWaitParams
            ((SynchWaitParams *)local_b8,(MuHow)how_arg,(Condition *)0x0,local_c0,mutex,thread_arg,
             (atomic<long> *)this);
  Mutex::UnlockSlow(mutex,(SynchWaitParams *)local_b8);
  this_local = (CondVar *)t.rep_;
  while (SVar3 = std::atomic<absl::lts_20240722::base_internal::PerThreadSynch::State>::load
                           ((atomic<absl::lts_20240722::base_internal::PerThreadSynch::State> *)
                            ((long)&waitp.cvmu[3].mu_.super___atomic_base<long>._M_i + 4),
                            memory_order_acquire), SVar3 == kQueued) {
    local_c8 = this_local;
    bVar2 = Mutex::DecrementSynchSem(mutex,(PerThreadSynch *)waitp.cvmu,(KernelTimeout)this_local);
    if (!bVar2) {
      this_local = (CondVar *)synchronization_internal::KernelTimeout::Never();
      absl_raw_log_internal_basename = (char *)this_local;
      Remove(this,(PerThreadSynch *)waitp.cvmu);
      mutex_v._7_1_ = true;
    }
  }
  if (waitp.cvmu[4].mu_.super___atomic_base<long>._M_i != 0) {
    waitp.cvmu[4].mu_.super___atomic_base<long>._M_i = 0;
    local_e0 = this;
    base_internal::AtomicHook<void(*)(char_const*,void_const*)>::operator()
              ((anonymous_namespace)::cond_var_tracer,(char (*) [7])"Unwait",&local_e0);
    if ((uVar1 & 2) != 0) {
      PostSynchEvent(this,0xb);
    }
    Mutex::Trans(mutex,(MuHow)how_arg);
    return mutex_v._7_1_;
  }
  local_d8 = "mutex.cc";
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"mutex.cc",0xa4f,"Check %s failed: %s","waitp.thread->waitp != nullptr",
             "not waiting when should be");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0xa4f,"bool absl::CondVar::WaitCommon(Mutex *, KernelTimeout)");
}

Assistant:

bool CondVar::WaitCommon(Mutex* mutex, KernelTimeout t) {
  bool rc = false;  // return value; true iff we timed-out

  intptr_t mutex_v = mutex->mu_.load(std::memory_order_relaxed);
  Mutex::MuHow mutex_how = ((mutex_v & kMuWriter) != 0) ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_UNLOCK(mutex, TsanFlags(mutex_how));

  // maybe trace this call
  intptr_t v = cv_.load(std::memory_order_relaxed);
  cond_var_tracer("Wait", this);
  if ((v & kCvEvent) != 0) {
    PostSynchEvent(this, SYNCH_EV_WAIT);
  }

  // Release mu and wait on condition variable.
  SynchWaitParams waitp(mutex_how, nullptr, t, mutex,
                        Synch_GetPerThreadAnnotated(mutex), &cv_);
  // UnlockSlow() will call CondVarEnqueue() just before releasing the
  // Mutex, thus queuing this thread on the condition variable.  See
  // CondVarEnqueue() for the reasons.
  mutex->UnlockSlow(&waitp);

  // wait for signal
  while (waitp.thread->state.load(std::memory_order_acquire) ==
         PerThreadSynch::kQueued) {
    if (!Mutex::DecrementSynchSem(mutex, waitp.thread, t)) {
      // DecrementSynchSem returned due to timeout.
      // Now we will either (1) remove ourselves from the wait list in Remove
      // below, in which case Remove will set thread.state = kAvailable and
      // we will not call DecrementSynchSem again; or (2) Signal/SignalAll
      // has removed us concurrently and is calling Wakeup, which will set
      // thread.state = kAvailable and post to the semaphore.
      // It's important to reset the timeout for the case (2) because otherwise
      // we can live-lock in this loop since DecrementSynchSem will always
      // return immediately due to timeout, but Signal/SignalAll is not
      // necessary set thread.state = kAvailable yet (and is not scheduled
      // due to thread priorities or other scheduler artifacts).
      // Note this could also be resolved if Signal/SignalAll would set
      // thread.state = kAvailable while holding the wait list spin lock.
      // But this can't be easily done for SignalAll since it grabs the whole
      // wait list with a single compare-exchange and does not really grab
      // the spin lock.
      t = KernelTimeout::Never();
      this->Remove(waitp.thread);
      rc = true;
    }
  }

  ABSL_RAW_CHECK(waitp.thread->waitp != nullptr, "not waiting when should be");
  waitp.thread->waitp = nullptr;  // cleanup

  // maybe trace this call
  cond_var_tracer("Unwait", this);
  if ((v & kCvEvent) != 0) {
    PostSynchEvent(this, SYNCH_EV_WAIT_RETURNING);
  }

  // From synchronization point of view Wait is unlock of the mutex followed
  // by lock of the mutex. We've annotated start of unlock in the beginning
  // of the function. Now, finish unlock and annotate lock of the mutex.
  // (Trans is effectively lock).
  ABSL_TSAN_MUTEX_POST_UNLOCK(mutex, TsanFlags(mutex_how));
  ABSL_TSAN_MUTEX_PRE_LOCK(mutex, TsanFlags(mutex_how));
  mutex->Trans(mutex_how);  // Reacquire mutex
  ABSL_TSAN_MUTEX_POST_LOCK(mutex, TsanFlags(mutex_how), 0);
  return rc;
}